

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

int Clasp::xconvert(char *x,OptParams *out,char **err,int e)

{
  bool bVar1;
  int iVar2;
  undefined4 in_ECX;
  char *in_RDX;
  uint *in_RSI;
  char **in_RDI;
  Set<Clasp::OptParams::UscOption> opts;
  anon_union_4_2_743abb88 algo;
  Type t;
  uint len;
  uint n;
  char *next;
  char *it;
  undefined4 in_stack_ffffffffffffffb8;
  Set<Clasp::OptParams::UscOption> in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar4 = 0;
  iVar3 = 0;
  iVar2 = Potassco::xconvert((char *)in_RDI,
                             (uint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             (char **)0x0,in_stack_ffffffffffffffc4);
  if ((iVar2 == 0) ||
     (bVar1 = setOptLegacy((OptParams *)
                           CONCAT44(in_stack_ffffffffffffffbc.val,in_stack_ffffffffffffffb8),0),
     !bVar1)) {
    iVar2 = xconvert(in_RDX,(Type *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                     in_stack_ffffffffffffffd4);
    if (iVar2 != 0) {
      setOptLegacy((OptParams *)CONCAT44(in_stack_ffffffffffffffbc.val,in_stack_ffffffffffffffb8),0)
      ;
      in_RDI = (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      iVar3 = iVar3 + 1;
      if (*(char *)in_RDI == ',') {
        iVar2 = Potassco::xconvert((char *)in_RDI,
                                   (uint *)CONCAT44(in_stack_ffffffffffffffd4,
                                                    in_stack_ffffffffffffffd0),
                                   (char **)CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffc4);
        if ((iVar2 == 0) ||
           (bVar1 = setOptLegacy((OptParams *)
                                 CONCAT44(in_stack_ffffffffffffffbc.val,in_stack_ffffffffffffffb8),0
                                ), !bVar1)) {
          if ((in_stack_ffffffffffffffc4 == 0) &&
             (iVar2 = xconvert(in_RDX,(BBAlgo *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                               in_stack_ffffffffffffffd4), iVar2 != 0)) {
            *in_RSI = *in_RSI & 0xffffffe7 | (in_stack_ffffffffffffffc0 & 3) << 3;
            in_RDI = (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
            iVar3 = iVar3 + 1;
          }
          else if (in_stack_ffffffffffffffc4 == 1) {
            Potassco::Set<Clasp::OptParams::UscOption>::Set
                      ((Set<Clasp::OptParams::UscOption> *)&stack0xffffffffffffffbc,0);
            iVar2 = xconvert(in_RDX,(UscAlgo *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                             in_stack_ffffffffffffffd4);
            if (iVar2 != 0) {
              *in_RSI = *in_RSI & 0xffffffe7 | (in_stack_ffffffffffffffc0 & 3) << 3;
              in_RDI = (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
              iVar3 = iVar3 + 1;
              if (((*(char *)in_RDI == ',') && (in_stack_ffffffffffffffc0 == 2)) &&
                 (iVar2 = Potassco::xconvert((char *)in_RDI,
                                             (uint *)CONCAT44(in_stack_ffffffffffffffd4,
                                                              in_stack_ffffffffffffffd0),
                                             (char **)CONCAT44(uVar4,iVar3),
                                             in_stack_ffffffffffffffc4), iVar2 != 0)) {
                *in_RSI = *in_RSI & 0x1ffff | (uVar4 & 0x7fff) << 0x11;
                if ((uVar4 & 0x7fff) != uVar4) {
                  *in_RSI = *in_RSI & 0x1ffff;
                  *in_RSI = *in_RSI & 0x1ffff | (*in_RSI >> 0x11 ^ 0xffffffff) << 0x11;
                }
                in_RDI = (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
                iVar3 = iVar3 + 1;
              }
            }
            if ((*(char *)in_RDI == ',') &&
               ((iVar2 = Potassco::xconvert((char *)CONCAT44(in_stack_ffffffffffffffd4,
                                                             in_stack_ffffffffffffffd0),
                                            (OffType *)CONCAT44(uVar4,iVar3),
                                            (char **)CONCAT44(in_stack_ffffffffffffffc4,
                                                              in_stack_ffffffffffffffc0),
                                            in_stack_ffffffffffffffbc.val), iVar2 != 0 ||
                (iVar2 = Potassco::xconvert<Clasp::OptParams::UscOption>
                                   (it,(Set<Clasp::OptParams::UscOption> *)next,_len,t), iVar2 != 0)
                ))) {
              uVar4 = Potassco::Set<Clasp::OptParams::UscOption>::value
                                ((Set<Clasp::OptParams::UscOption> *)&stack0xffffffffffffffbc);
              *in_RSI = *in_RSI & 0xfffff0ff | (uVar4 & 0xf) << 8;
              in_RDI = (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
              iVar3 = iVar3 + 1;
            }
          }
        }
        else {
          in_RDI = (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
          iVar3 = iVar3 + 1;
        }
      }
    }
  }
  else {
    in_RDI = (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    iVar3 = iVar3 + 1;
  }
  if (in_RDX != (char *)0x0) {
    *(char ***)in_RDX = in_RDI;
  }
  return iVar3;
}

Assistant:

static int xconvert(const char* x, OptParams& out, const char** err, int e) {
	using Potassco::xconvert;
	using Potassco::toString;
	const char* it = x, *next;
	unsigned n = 0u, len = 0u;
	OptParams::Type t;
	// clasp-3.0: <n>
	if (xconvert(it, n, &next, e) && setOptLegacy(out, n)) {
		it = next; ++len;
	}
	else if (xconvert(it, t, &next, e)) {
		setOptLegacy(out, uint32(t)*4);
		it = next; ++len;
		if (*it == ',') {
			union { OptParams::BBAlgo bb; OptParams::UscAlgo usc; } algo;
			if (xconvert(it+1, n, &next, e) && setOptLegacy(out, n + (uint32(t)*4))) { // clasp-3.2: (bb|usc),<n>
				it = next; ++len;
			}
			else if (t == OptParams::type_bb && xconvert(it+1, algo.bb, &next, e)) {
				out.algo = algo.bb;
				it = next; ++len;
			}
			else if (t == OptParams::type_usc) {
				Potassco::Set<OptParams::UscOption> opts(0);
				if (xconvert(it+1, algo.usc, &next, e)) {
					out.algo = algo.usc;
					it = next; ++len;
					if (*it == ',' && algo.usc == OptParams::usc_k && xconvert(it + 1, n, &next)) {
						SET_OR_FILL(out.kLim, n);
						it = next; ++len;
					}
				}
				if (*it == ',' && (xconvert(it + 1, Potassco::off, &next, e) || xconvert(it + 1, opts, &next, e))) {
					out.opts = opts.value();
					it = next; ++len;
				}
			}
		}
	}
	if (err) { *err = it; }
	return static_cast<int>(len);
}